

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void move_termchar(termline *line,termchar *dest,termchar *src)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  wchar_t wVar3;
  undefined4 uVar4;
  
  clear_cc(line,(wchar_t)((ulong)((long)dest - (long)line->chars) >> 5));
  uVar1 = src->chr;
  uVar2 = src->attr;
  wVar3 = src->cc_next;
  uVar4 = *(undefined4 *)&src->field_0x1c;
  dest->truecolour = src->truecolour;
  dest->cc_next = wVar3;
  *(undefined4 *)&dest->field_0x1c = uVar4;
  dest->chr = uVar1;
  dest->attr = uVar2;
  if (src->cc_next != L'\0') {
    dest->cc_next = src->cc_next - (int)((ulong)((long)dest - (long)src) >> 5);
  }
  src->cc_next = L'\0';
  return;
}

Assistant:

static void move_termchar(termline *line, termchar *dest, termchar *src)
{
    /* First clear the cc list from the original char, just in case. */
    clear_cc(line, dest - line->chars);

    /* Move the character cell and adjust its cc_next. */
    *dest = *src;                      /* copy everything except cc-list */
    if (src->cc_next)
        dest->cc_next = src->cc_next - (dest-src);

    /* Ensure the original cell doesn't have a cc list. */
    src->cc_next = 0;

#ifdef TERM_CC_DIAGS
    cc_check(line);
#endif
}